

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convex_hull.cpp
# Opt level: O3

vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
* ear::convex_hull(vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                   *__return_storage_ptr__,
                  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *positions,double tolerance)

{
  double *pdVar1;
  int iVar2;
  pointer psVar3;
  array<unsigned_long,_3UL> *paVar4;
  const_iterator __begin4;
  pointer pMVar5;
  internal_error *this;
  pointer pMVar6;
  Matrix<double,_3,_1,_0,_3,_1> *pos;
  pointer pMVar7;
  long lVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  ulong uVar11;
  type rhs;
  Matrix<double,_3,_1,_0,_3,_1> *__args;
  long lVar12;
  _Base_ptr p_Var13;
  long lVar14;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *__range1;
  _Base_ptr p_Var15;
  double dVar16;
  ulong in_XMM0_Qb;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  *hull_facets;
  vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_> hull_tris
  ;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  hull_tri_normals;
  Facet f;
  Matrix<double,_3,_1,_0,_3,_1> local_108;
  array<unsigned_long,_3UL> *local_e8;
  iterator iStack_e0;
  array<unsigned_long,_3UL> *local_d8;
  int local_cc;
  void *local_c8;
  iterator iStack_c0;
  Matrix<double,_3,_1,_0,_3,_1> *local_b8;
  double local_a8;
  undefined1 local_98 [8];
  undefined1 auStack_90 [24];
  _Base_ptr local_78;
  size_t local_70;
  double local_68;
  ulong uStack_60;
  undefined1 local_58 [16];
  _Base_ptr local_48;
  _Base_ptr local_40;
  double local_38;
  
  pMVar5 = (positions->
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pMVar6 = (positions->
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pMVar5 == pMVar6) {
    dVar27 = 0.0;
    auVar21 = ZEXT816(0);
  }
  else {
    auVar21 = ZEXT816(0);
    dVar27 = 0.0;
    pMVar7 = pMVar5;
    do {
      dVar26 = auVar21._8_8_;
      auVar21._0_8_ =
           auVar21._0_8_ +
           (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[0];
      auVar21._8_8_ =
           dVar26 + (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
                    .m_data.array[1];
      dVar27 = dVar27 + (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                        m_storage.m_data.array[2];
      pMVar7 = pMVar7 + 1;
    } while (pMVar7 != pMVar6);
  }
  local_e8 = (array<unsigned_long,_3UL> *)0x0;
  iStack_e0._M_current = (array<unsigned_long,_3UL> *)0x0;
  local_d8 = (array<unsigned_long,_3UL> *)0x0;
  local_b8 = (Matrix<double,_3,_1,_0,_3,_1> *)0x0;
  local_c8 = (void *)0x0;
  iStack_c0._M_current = (Matrix<double,_3,_1,_0,_3,_1> *)0x0;
  local_a8 = tolerance;
  if ((long)pMVar6 - (long)pMVar5 == 0) {
    (__return_storage_ptr__->
    super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    lVar8 = ((long)pMVar6 - (long)pMVar5 >> 3) * -0x5555555555555555;
    auVar17._8_4_ = (int)((ulong)lVar8 >> 0x20);
    auVar17._0_8_ = lVar8;
    auVar17._12_4_ = 0x45300000;
    auVar18._0_8_ =
         (auVar17._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0);
    dVar27 = dVar27 / auVar18._0_8_;
    auVar18._8_8_ = auVar18._0_8_;
    local_58 = divpd(auVar21,auVar18);
    local_68 = -tolerance;
    uStack_60 = in_XMM0_Qb ^ 0x8000000000000000;
    p_Var15 = (_Base_ptr)0x0;
    local_38 = dVar27;
    do {
      local_48 = (_Base_ptr)((long)&p_Var15->_M_color + 1);
      p_Var9 = (_Base_ptr)(((long)pMVar6 - (long)pMVar5 >> 3) * -0x5555555555555555);
      p_Var13 = local_48;
      if (local_48 < p_Var9) {
        do {
          p_Var9 = (_Base_ptr)((long)&p_Var13->_M_color + 1);
          p_Var10 = (_Base_ptr)(((long)pMVar6 - (long)pMVar5 >> 3) * -0x5555555555555555);
          local_40 = p_Var9;
          if (p_Var9 < p_Var10) {
            do {
              dVar26 = pMVar5[(long)p_Var15].
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array[0];
              dVar16 = pMVar5[(long)p_Var13].
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array[0] - dVar26;
              pdVar1 = pMVar5[(long)p_Var15].
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array + 1;
              dVar19 = *pdVar1;
              dVar25 = pdVar1[1];
              pdVar1 = pMVar5[(long)p_Var13].
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array + 1;
              dVar23 = *pdVar1 - dVar19;
              dVar24 = pdVar1[1] - dVar25;
              dVar19 = pMVar5[(long)p_Var9].
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array[1] - dVar19;
              dVar25 = pMVar5[(long)p_Var9].
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array[2] - dVar25;
              dVar26 = pMVar5[(long)p_Var9].
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array[0] - dVar26;
              local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0] = dVar23 * dVar25 - dVar19 * dVar24;
              local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[1] = dVar24 * dVar26 - dVar25 * dVar16;
              local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[2] = dVar16 * dVar19 - dVar26 * dVar23;
              auVar20._0_8_ =
                   local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[2] *
                   local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[2] +
                   local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[1] *
                   local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[1] +
                   local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[0] *
                   local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[0];
              if (auVar20._0_8_ <= local_a8) {
                this = (internal_error *)__cxa_allocate_exception(0x10);
                local_98 = (undefined1  [8])(auStack_90 + 8);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_98,"collinear points in convex hull","");
                internal_error::internal_error(this,(string *)local_98);
                __cxa_throw(this,&internal_error::typeinfo,std::runtime_error::~runtime_error);
              }
              if (0.0 < auVar20._0_8_) {
                auVar20._8_8_ = 0;
                auVar21 = sqrtpd(auVar20,auVar20);
                auVar22._0_8_ = auVar21._0_8_;
                local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[2] =
                     local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[2] / auVar22._0_8_;
                auVar22._8_8_ = auVar22._0_8_;
                local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array._0_16_ =
                     divpd((undefined1  [16])
                           local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                           m_storage.m_data.array._0_16_,auVar22);
              }
              auVar21 = *(undefined1 (*) [16])
                         pMVar5[(long)p_Var15].
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array;
              dVar19 = auVar21._0_8_;
              dVar25 = auVar21._8_8_;
              dVar26 = pMVar5[(long)p_Var15].
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array[2];
              dVar27 = (dVar27 - dVar26) *
                       local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[2] +
                       ((double)local_58._8_8_ - dVar25) *
                       local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[1] +
                       ((double)local_58._0_8_ - dVar19) *
                       local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[0];
              if (local_a8 <= ABS(dVar27)) {
                for (; pMVar5 != pMVar6; pMVar5 = pMVar5 + 1) {
                  dVar16 = ((pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                            m_storage.m_data.array[2] - dVar26) *
                           local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                           m_storage.m_data.array[2] +
                           ((pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                            m_storage.m_data.array[1] - dVar25) *
                           local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                           m_storage.m_data.array[1] +
                           ((pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                            m_storage.m_data.array[0] - dVar19) *
                           local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                           m_storage.m_data.array[0];
                  if (dVar27 <= 0.0) {
                    if (local_a8 <= dVar16) goto LAB_0016fe96;
                  }
                  else if (dVar16 <= local_68) goto LAB_0016fe96;
                }
                local_98 = (undefined1  [8])p_Var15;
                auStack_90._0_8_ = p_Var13;
                auStack_90._8_8_ = p_Var9;
                if (iStack_e0._M_current == local_d8) {
                  std::
                  vector<std::array<unsigned_long,3ul>,std::allocator<std::array<unsigned_long,3ul>>>
                  ::_M_realloc_insert<std::array<unsigned_long,3ul>>
                            ((vector<std::array<unsigned_long,3ul>,std::allocator<std::array<unsigned_long,3ul>>>
                              *)&local_e8,iStack_e0,(array<unsigned_long,_3UL> *)local_98);
                }
                else {
                  (iStack_e0._M_current)->_M_elems[2] = (unsigned_long)p_Var9;
                  (iStack_e0._M_current)->_M_elems[0] = (unsigned_long)p_Var15;
                  (iStack_e0._M_current)->_M_elems[1] = (unsigned_long)p_Var13;
                  iStack_e0._M_current = iStack_e0._M_current + 1;
                }
                if (iStack_c0._M_current == local_b8) {
                  std::
                  vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                  ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>const&>
                            ((vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                              *)&local_c8,iStack_c0,&local_108);
                }
                else {
                  ((iStack_c0._M_current)->
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                  array[2] = local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                             m_storage.m_data.array[2];
                  ((iStack_c0._M_current)->
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                  array[0] = local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                             m_storage.m_data.array[0];
                  ((iStack_c0._M_current)->
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                  array[1] = local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                             m_storage.m_data.array[1];
                  iStack_c0._M_current = iStack_c0._M_current + 1;
                }
              }
LAB_0016fe96:
              p_Var9 = (_Base_ptr)((long)&p_Var9->_M_color + 1);
              pMVar5 = (positions->
                       super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pMVar6 = (positions->
                       super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
              p_Var10 = (_Base_ptr)(((long)pMVar6 - (long)pMVar5 >> 3) * -0x5555555555555555);
              dVar27 = local_38;
            } while (p_Var9 < p_Var10);
          }
          p_Var13 = local_40;
        } while (local_40 < p_Var10);
        p_Var9 = (_Base_ptr)(((long)pMVar6 - (long)pMVar5 >> 3) * -0x5555555555555555);
      }
      p_Var15 = local_48;
    } while (local_48 < p_Var9);
    (__return_storage_ptr__->
    super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = 0.0;
    local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array.
    _0_16_ = ZEXT816(0);
    if (iStack_e0._M_current != local_e8) {
      local_68 = 0.0;
      uVar11 = 0;
      do {
        dVar27 = local_68;
        paVar4 = local_e8;
        local_58._0_8_ = uVar11;
        __args = (Matrix<double,_3,_1,_0,_3,_1> *)(uVar11 * 0x18 + (long)local_c8);
        psVar3 = (__return_storage_ptr__->
                 super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar8 = (long)(__return_storage_ptr__->
                      super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)psVar3;
        if (lVar8 != 0) {
          lVar8 = (lVar8 >> 4) * -0x5555555555555555;
          pMVar5 = (positions->
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          lVar8 = lVar8 + (ulong)(lVar8 == 0);
          lVar12 = 0;
          lVar14 = 0;
LAB_0016ffae:
          iVar2 = *(int *)(*(long *)((long)&(psVar3->_M_t)._M_impl.super__Rb_tree_header +
                                    lVar12 * 2 + 0x10U) + 0x20);
          dVar19 = SUB168(*(undefined1 (*) [16])
                           ((long)local_108.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                  m_storage.m_data.array[0] + lVar12),0);
          dVar25 = SUB168(*(undefined1 (*) [16])
                           ((long)local_108.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                  m_storage.m_data.array[0] + lVar12),8);
          dVar26 = *(double *)
                    ((long)local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                           m_storage.m_data.array[0] + 0x10 + lVar12);
          if ((local_a8 <=
               ABS((*(double *)
                     ((long)&pMVar5[local_e8[uVar11]._M_elems[0]].
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                             m_data + 0x10) -
                   *(double *)
                    ((long)&pMVar5[iVar2].
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                            m_data + 0x10)) * dVar26 +
                   (*(double *)
                     ((long)&pMVar5[local_e8[uVar11]._M_elems[0]].
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                             m_data + 8) -
                   *(double *)
                    ((long)&pMVar5[iVar2].
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                            m_data + 8)) * dVar25 +
                   (pMVar5[local_e8[uVar11]._M_elems[0]].
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                    array[0] -
                   pMVar5[iVar2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[0]) * dVar19)) ||
             (dVar16 = (__args->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data.array[0],
             dVar23 = (__args->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                      m_storage.m_data.array[1],
             dVar24 = (__args->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                      m_storage.m_data.array[2], dVar28 = dVar24 * dVar25 - dVar26 * dVar23,
             dVar24 = dVar16 * dVar26 - dVar19 * dVar24, dVar26 = dVar19 * dVar23 - dVar25 * dVar16,
             local_a8 <= dVar26 * dVar26 + dVar24 * dVar24 + dVar28 * dVar28)) goto LAB_0017006f;
          lVar8 = 0;
          do {
            local_98._0_4_ = *(undefined4 *)((long)paVar4->_M_elems + lVar8 + (long)dVar27);
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            _M_insert_unique<int>
                      ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                        *)((long)(__return_storage_ptr__->
                                 super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start - lVar14),
                       (int *)local_98);
            lVar8 = lVar8 + 8;
          } while (lVar8 != 0x18);
          goto LAB_0017015a;
        }
LAB_00170080:
        auStack_90._0_8_ = auStack_90._0_8_ & 0xffffffff00000000;
        auStack_90._8_8_ = (_Base_ptr)0x0;
        auStack_90._16_8_ = auStack_90;
        local_70 = 0;
        lVar8 = 0;
        local_78 = (_Base_ptr)auStack_90._16_8_;
        do {
          local_cc = *(int *)((long)paVar4->_M_elems + lVar8 + (long)dVar27);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          _M_insert_unique<int>
                    ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                      *)local_98,&local_cc);
          lVar8 = lVar8 + 8;
        } while (lVar8 != 0x18);
        std::
        vector<std::set<int,std::less<int>,std::allocator<int>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
        ::emplace_back<std::set<int,std::less<int>,std::allocator<int>>>
                  ((vector<std::set<int,std::less<int>,std::allocator<int>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                    *)__return_storage_ptr__,
                   (set<int,_std::less<int>,_std::allocator<int>_> *)local_98);
        if (local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[1] ==
            local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2]) {
          std::
          vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>::
          _M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>const&>
                    ((vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                      *)&local_108,
                     (iterator)
                     local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[1],__args);
        }
        else {
          (((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
           local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1])->m_storage).m_data.array[2] =
               (__args->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[2];
          dVar27 = (__args->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                   m_data.array[1];
          (((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
           local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1])->m_storage).m_data.array[0] =
               (__args->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[0];
          (((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
           local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1])->m_storage).m_data.array[1] = dVar27;
          local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1] = (double)((long)local_108.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                    m_storage.m_data.array[1] + 0x18);
        }
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                  local_98);
LAB_0017015a:
        uVar11 = local_58._0_8_ + 1;
        local_68 = (double)((long)local_68 + 0x18);
      } while (uVar11 < (ulong)(((long)iStack_e0._M_current - (long)local_e8 >> 3) *
                               -0x5555555555555555));
      if ((void *)local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[0] != (void *)0x0) {
        operator_delete((void *)local_108.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                m_storage.m_data.array[0],
                        (long)local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                              .m_storage.m_data.array[2] -
                        (long)local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                              .m_storage.m_data.array[0]);
      }
    }
  }
  if (local_c8 != (void *)0x0) {
    operator_delete(local_c8,(long)local_b8 - (long)local_c8);
  }
  if (local_e8 != (array<unsigned_long,_3UL> *)0x0) {
    operator_delete(local_e8,(long)local_d8 - (long)local_e8);
  }
  return __return_storage_ptr__;
LAB_0017006f:
  lVar14 = lVar14 + -0x30;
  lVar12 = lVar12 + 0x18;
  lVar8 = lVar8 + -1;
  if (lVar8 == 0) goto LAB_00170080;
  goto LAB_0016ffae;
}

Assistant:

std::vector<Facet> convex_hull(const std::vector<Eigen::Vector3d> &positions,
                                 double tolerance) {
    using Vec = Eigen::Vector3d;
    using Tri = std::array<size_t, 3>;

    // the mean point, guaranteed to be inside the convex hull
    Vec inside_point = Vec::Zero();
    for (auto &pos : positions) inside_point += pos;
    inside_point /= (double)positions.size();

    // find all triangles on the convex hull:
    // - iterate through all possible triangles
    // - find the triangle normal, checking for collinearity
    // - it's on the convex hull if:
    //    - the inside point is not on the plane of the triangle
    //    - all points are on the same side of the plane of the triangle as the
    //    inside point
    std::vector<Tri> hull_tris;
    std::vector<Vec> hull_tri_normals;

    for (size_t i = 0; i < positions.size(); i++)
      for (size_t j = i + 1; j < positions.size(); j++)
        for (size_t k = j + 1; k < positions.size(); k++) {
          Vec normal =
              (positions[j] - positions[i]).cross(positions[k] - positions[i]);
          ear_assert(normal.squaredNorm() > tolerance,
                     "collinear points in convex hull");
          normal.normalize();  // XXX: not really required, but helps make
                               // tolerances consistent

          double dot_inside = normal.dot(inside_point - positions[i]);

          if (std::abs(dot_inside) < tolerance)
            continue;  // tri coplanar with inside point

          bool points_on_same_side_as_inside = true;
          for (auto &pos : positions) {
            double dot_point = normal.dot(pos - positions[i]);

            // check if signs are equal, with tolerance
            if (!(dot_inside > 0 ? dot_point > -tolerance
                                 : dot_point < tolerance)) {
              points_on_same_side_as_inside = false;
              break;
            }
          }

          if (points_on_same_side_as_inside) {
            hull_tris.push_back({i, j, k});
            hull_tri_normals.push_back(normal);
          }
        }

    // merge coplanar triangles into facets
    std::vector<Facet> hull_facets;
    std::vector<Vec> hull_facet_normals;

    for (size_t tri_i = 0; tri_i < hull_tris.size(); tri_i++) {
      const Vec &tri_point = positions[hull_tris[tri_i][0]];
      const Vec &tri_norm = hull_tri_normals[tri_i];

      // check each facet to see if this triangle is on the same plane.
      // if it is, add the points to the facet. if no facet is found, make a
      // new facet.
      bool found_facet = false;
      for (size_t facet_i = 0; facet_i < hull_facets.size(); facet_i++) {
        const Vec &facet_norm = hull_facet_normals[facet_i];
        const Vec &facet_point = positions[*hull_facets[facet_i].begin()];

        // they are on the same plane if the line between the test points is
        // not along the normal, and if the normals point in the same or
        // opposite direction. alternatively, we could just test all tri
        // vertices.
        if (std::abs((tri_point - facet_point).dot(facet_norm)) < tolerance &&
            facet_norm.cross(tri_norm).squaredNorm() < tolerance) {
          for (size_t corner_idx : hull_tris[tri_i]) {
            hull_facets[facet_i].insert((Facet::value_type)corner_idx);
          }

          found_facet = true;
          break;
        }
      }

      if (!found_facet) {
        Facet f;
        for (size_t corner_idx : hull_tris[tri_i])
          f.insert((Facet::value_type)corner_idx);
        hull_facets.push_back(std::move(f));
        hull_facet_normals.push_back(tri_norm);
      }
    }

    return hull_facets;
  }